

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFreloc.c
# Opt level: O0

void NFreloc(NF_link_map *l,ProxyRecord *records)

{
  int local_1c;
  int i;
  ProxyRecord *records_local;
  NF_link_map *l_local;
  
  if (l->l_info[7] != (Elf64_Dyn *)0x0) {
    ranges[0].start = (l->l_info[7]->d_un).d_ptr;
    ranges[0].size = (l->l_info[8]->d_un).d_ptr;
    ranges[0].nrelative = (l->l_info[0x22]->d_un).d_val;
  }
  if (l->l_info[0x14] != (Elf64_Dyn *)0x0) {
    ranges[1].start = (l->l_info[0x17]->d_un).d_ptr;
    ranges[1].size = (l->l_info[2]->d_un).d_ptr;
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    do_reloc(l,ranges + local_1c,records);
  }
  return;
}

Assistant:

void NFreloc(struct NF_link_map *l, const ProxyRecord *records)
{
    /* set up range[0] for relative reloc and global vars */
    if (l->l_info[DT_RELA])
    {
        ranges[0].start = l->l_info[DT_RELA]->d_un.d_ptr;
        ranges[0].size = l->l_info[DT_RELASZ]->d_un.d_val;
        ranges[0].nrelative = l->l_info[34]->d_un.d_val; //relacount is now at 34
    }
    /* set up range[1] for function reloc */
    if (l->l_info[DT_PLTREL]) //TODO: Also check reloc type: it is REL/RELA? Only 2 options?
    {
        ranges[1].start = l->l_info[DT_JMPREL]->d_un.d_ptr;
        ranges[1].size = l->l_info[DT_PLTRELSZ]->d_un.d_val;
        //TODO: check lazy or not here
    }

    /* do actucal reloc here using ranges set up */
    for (int i = 0; i < 2; ++i)
        do_reloc(l, &ranges[i], records);

    /* UPD: this is totally wrong, for unload search list should be in the destructor of the NF */
    /* NFclose function should take care of this */
    /* now the reloc is done, dlclose the dlopened objs before */
    /* struct link_map **lm = l -> l_search_list;
    while(*lm)
    {
        dlclose(*lm);
        lm++;
    } */
    //TODO: add a mprotect to protect the already relocated entries from writing
}